

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int binstrr(bstring b1,int pos,bstring b2)

{
  uint uVar1;
  int iVar2;
  uchar *puVar3;
  int iVar4;
  uchar *puVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  iVar4 = -1;
  if (((((b1 != (bstring)0x0) && (puVar5 = b1->data, puVar5 != (uchar *)0x0)) &&
       (uVar1 = b1->slen, b2 != (bstring)0x0 && -1 < (int)uVar1)) &&
      ((puVar3 = b2->data, puVar3 != (uchar *)0x0 && (iVar2 = b2->slen, -1 < iVar2)))) &&
     (iVar4 = pos, uVar1 != pos || iVar2 != 0)) {
    iVar4 = -1;
    if ((uint)pos <= uVar1) {
      iVar4 = pos;
    }
    if (((uint)pos <= uVar1 && iVar2 != 0) &&
       (iVar4 = 0, (pos != 0 || puVar5 != puVar3) || (int)uVar1 < iVar2)) {
      iVar7 = uVar1 - iVar2;
      iVar4 = -1;
      if (-1 < iVar7) {
        iVar6 = pos;
        if (iVar7 < pos) {
          iVar6 = iVar7;
        }
        lVar8 = (long)iVar7;
        if ((long)pos < (long)iVar7) {
          lVar8 = (long)pos;
        }
        puVar5 = puVar5 + lVar8;
        while( true ) {
          lVar8 = 0;
          while (puVar3[lVar8] == puVar5[lVar8]) {
            lVar8 = lVar8 + 1;
            if (iVar2 <= (int)lVar8) {
              return iVar6;
            }
          }
          if (iVar6 < 1) break;
          iVar6 = iVar6 + -1;
          puVar5 = puVar5 + -1;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int binstrr (const bstring b1, int pos, const bstring b2) {
int j, i, l;
unsigned char * d0, * d1;

	if (b1 == NULL || b1->data == NULL || b1->slen < 0 ||
	    b2 == NULL || b2->data == NULL || b2->slen < 0) return BSTR_ERR;
	if (b1->slen == pos && b2->slen == 0) return pos;
	if (b1->slen < pos || pos < 0) return BSTR_ERR;
	if (b2->slen == 0) return pos;

	/* Obvious alias case */
	if (b1->data == b2->data && pos == 0 && b2->slen <= b1->slen) return 0;

	i = pos;
	if ((l = b1->slen - b2->slen) < 0) return BSTR_ERR;

	/* If no space to find such a string then snap back */
	if (l + 1 <= i) i = l;
	j = 0;

	d0 = b2->data;
	d1 = b1->data;
	l  = b2->slen;

	for (;;) {
		if (d0[j] == d1[i + j]) {
			j ++;
			if (j >= l) return i;
		} else {
			i --;
			if (i < 0) break;
			j=0;
		}
	}

	return BSTR_ERR;
}